

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

void __thiscall
BoardView::SearchColumnGenerate
          (BoardView *this,string *title,
          pair<std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>,_std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>_>
          *results,char *search,int limit)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  s;
  allocator<char> local_bd;
  int local_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> local_50;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> local_38;
  
  local_a0._M_dataplus._M_p = (pointer)0x0;
  local_bc = limit;
  bVar1 = ImGui::BeginListBox((title->_M_dataplus)._M_p,(ImVec2 *)&local_a0);
  if (bVar1) {
    if (this->m_searchComponents == true) {
      if (((results->first).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (results->first).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->m_searchNets != true ||
          ((results->second).
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (results->second).
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_finish)))) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,search,&local_bd);
        SpellCorrector::suggest(&local_b8,&this->scparts,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          ImGui::Text("Did you mean...");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_68,&local_b8);
          ShowSearchResults<std::__cxx11::string>(this,&local_68,search,&local_bc,0x115f2c);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_68);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
      }
      else {
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        vector(&local_38,&results->first);
        ShowSearchResults<std::shared_ptr<Component>>(this,&local_38,search,&local_bc,0x115f2c);
        std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
        ~vector(&local_38);
      }
    }
    if (this->m_searchNets == true) {
      if (((results->second).
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (results->second).
           super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         ((this->m_searchComponents != true ||
          ((results->first).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (results->first).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)))) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,search,&local_bd);
        SpellCorrector::suggest(&local_b8,&this->scnets,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          ImGui::Text("Did you mean...");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_80,&local_b8);
          ShowSearchResults<std::__cxx11::string>(this,&local_80,search,&local_bc,0x115f76);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_80);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b8);
      }
      else {
        std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::vector
                  (&local_50,&results->second);
        ShowSearchResults<std::shared_ptr<Net>>(this,&local_50,search,&local_bc,0x115f76);
        std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::~vector
                  (&local_50);
      }
    }
    ImGui::EndListBox();
  }
  return;
}

Assistant:

void BoardView::SearchColumnGenerate(const std::string &title,
                                     std::pair<SharedVector<Component>, SharedVector<Net>> results,
                                     char *search,
                                     int limit) {
	if (ImGui::BeginListBox(title.c_str())) {

		if (m_searchComponents) {
			if (results.first.empty() && (!m_searchNets || results.second.empty())) { // show suggestions only if there is no result at all
				auto s = scparts.suggest(search);
				if (s.size() > 0) {
					ImGui::Text("Did you mean...");
					ShowSearchResults(s, search, limit, &BoardView::FindComponent);
				}
			} else
				ShowSearchResults(results.first, search, limit, &BoardView::FindComponent);
		}

		if (m_searchNets) {
			if (results.second.empty() && (!m_searchComponents || results.first.empty())) {
				auto s = scnets.suggest(search);
				if (s.size() > 0) {
					ImGui::Text("Did you mean...");
					ShowSearchResults(s, search, limit, &BoardView::FindNet);
				}
			} else
				ShowSearchResults(results.second, search, limit, &BoardView::FindNet);
		}

		ImGui::EndListBox();
	}
}